

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall Highs::formStandardFormLp(Highs *this)

{
  HighsSparseMatrix *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer piVar8;
  pointer piVar9;
  long lVar10;
  HighsInt *pHVar11;
  long lVar12;
  HighsInt iCol;
  long lVar13;
  ulong uVar14;
  HighsInt iRow;
  size_type __new_size;
  double dVar15;
  double dVar16;
  double lower;
  uint local_3c4;
  HighsSparseMatrix *local_3c0;
  vector<double,_std::allocator<double>_> *local_3b8;
  uint local_3b0;
  uint local_3ac;
  HighsSparseMatrix *local_3a8;
  double upper;
  uint local_394;
  vector<double,_std::allocator<double>_> *local_390;
  ulong local_388;
  ulong local_380;
  ulong local_378;
  ulong local_370;
  vector<int,_std::allocator<int>_> slack_ix;
  HighsSparseMatrix local_row;
  HighsSparseMatrix local_2d0;
  HighsSparseMatrix local_260;
  HighsSparseMatrix local_1f0;
  HighsSparseMatrix local_180;
  HighsSparseMatrix local_110;
  HighsSparseMatrix local_a0;
  
  clearStandardFormLp(this);
  this_00 = &(this->model_).lp_.a_matrix_;
  HighsSparseMatrix::ensureRowwise(this_00);
  dVar15 = (double)(this->model_).lp_.sense_;
  this->standard_form_offset_ = (this->model_).lp_.offset_ * dVar15;
  local_390 = &this->standard_form_cost_;
  for (lVar13 = 0; uVar3 = (this->model_).lp_.num_col_, lVar13 < (int)uVar3; lVar13 = lVar13 + 1) {
    local_row._0_8_ =
         (this->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar13] * dVar15;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (local_390,(double *)&local_row);
  }
  (this->standard_form_matrix_).format_ = kRowwise;
  (this->standard_form_matrix_).num_col_ = uVar3;
  HighsSparseMatrix::HighsSparseMatrix(&local_row);
  HighsSparseMatrix::ensureRowwise(&local_row);
  __new_size = 2;
  if (2 < (int)uVar3) {
    __new_size = (size_type)uVar3;
  }
  local_row.num_row_ = 1;
  local_row.num_col_ = (this->model_).lp_.num_col_;
  std::vector<int,_std::allocator<int>_>::resize(&local_row.index_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&local_row.value_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&local_row.start_,2);
  local_3c0 = &this->standard_form_matrix_;
  *local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = 0;
  pHVar11 = local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + 1;
  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3b8 = &this->standard_form_rhs_;
  uVar14 = 0;
  local_378 = 0;
  local_380 = 0;
  local_388 = 0;
  local_370 = 0;
  for (lVar13 = 0; lVar13 < (this->model_).lp_.num_row_; lVar13 = lVar13 + 1) {
    lower = (this->model_).lp_.row_lower_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar13];
    upper = (this->model_).lp_.row_upper_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar13];
    if ((-INFINITY < lower) || (upper < INFINITY)) {
      iRow = (HighsInt)lVar13;
      if ((lower != upper) || (NAN(lower) || NAN(upper))) {
        if (-INFINITY < lower) {
          local_3c4 = ~(uint)((ulong)((long)(this->standard_form_rhs_).
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->standard_form_rhs_).
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 3);
          if (upper < INFINITY) {
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(&slack_ix,(int *)&local_3c4);
            HighsSparseMatrix::getRow
                      (this_00,iRow,pHVar11,
                       local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
            HighsSparseMatrix::HighsSparseMatrix(&local_260,&local_row);
            HighsSparseMatrix::addRows(local_3c0,&local_260,(int8_t *)0x0);
            HighsSparseMatrix::~HighsSparseMatrix(&local_260);
            std::vector<double,_std::allocator<double>_>::push_back(local_3b8,&lower);
            local_3c4 = (int)((ulong)((long)(this->standard_form_rhs_).
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->standard_form_rhs_).
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(&slack_ix,(int *)&local_3c4);
            HighsSparseMatrix::HighsSparseMatrix(&local_2d0,&local_row);
            HighsSparseMatrix::addRows(local_3c0,&local_2d0,(int8_t *)0x0);
            HighsSparseMatrix::~HighsSparseMatrix(&local_2d0);
            std::vector<double,_std::allocator<double>_>::push_back(local_3b8,&upper);
            local_388 = (ulong)((int)local_388 + 1);
          }
          else {
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(&slack_ix,(int *)&local_3c4);
            HighsSparseMatrix::getRow
                      (this_00,iRow,pHVar11,
                       local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
            HighsSparseMatrix::HighsSparseMatrix(&local_1f0,&local_row);
            HighsSparseMatrix::addRows(local_3c0,&local_1f0,(int8_t *)0x0);
            HighsSparseMatrix::~HighsSparseMatrix(&local_1f0);
            std::vector<double,_std::allocator<double>_>::push_back(local_3b8,&lower);
            local_380 = (ulong)((int)local_380 + 1);
          }
        }
        else {
          local_3c4 = (int)((ulong)((long)(this->standard_form_rhs_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->standard_form_rhs_).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start) >> 3) + 1;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&slack_ix,(int *)&local_3c4);
          HighsSparseMatrix::getRow
                    (this_00,iRow,pHVar11,
                     local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
          HighsSparseMatrix::HighsSparseMatrix(&local_180,&local_row);
          HighsSparseMatrix::addRows(local_3c0,&local_180,(int8_t *)0x0);
          HighsSparseMatrix::~HighsSparseMatrix(&local_180);
          std::vector<double,_std::allocator<double>_>::push_back(local_3b8,&upper);
          local_378 = (ulong)((int)local_378 + 1);
        }
      }
      else {
        HighsSparseMatrix::getRow
                  (this_00,iRow,pHVar11,
                   local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start);
        HighsSparseMatrix::HighsSparseMatrix(&local_110,&local_row);
        HighsSparseMatrix::addRows(local_3c0,&local_110,(int8_t *)0x0);
        HighsSparseMatrix::~HighsSparseMatrix(&local_110);
        std::vector<double,_std::allocator<double>_>::push_back(local_3b8,&upper);
        local_370 = (ulong)((int)local_370 + 1);
      }
    }
    else {
      uVar14 = (ulong)((int)uVar14 + 1);
    }
  }
  local_3a8 = this_00;
  for (lVar13 = 0; lVar13 < (this->model_).lp_.num_col_; lVar13 = lVar13 + 1) {
    lower = (this->model_).lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar13];
    if (((this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar13] != -INFINITY) && (lower != INFINITY)) {
      upper = 0.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_390,&upper);
      pHVar11 = &(this->standard_form_matrix_).num_col_;
      *pHVar11 = *pHVar11 + 1;
      local_row.num_col_ = local_row.num_col_ + 1;
      *local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start = (int)lVar13;
      local_row.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[1] = (this->standard_form_matrix_).num_col_ + -1;
      *local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 1.0;
      local_row.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[1] = 1.0;
      local_row.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[1] = 2;
      HighsSparseMatrix::HighsSparseMatrix(&local_a0,&local_row);
      HighsSparseMatrix::addRows(local_3c0,&local_a0,(int8_t *)0x0);
      HighsSparseMatrix::~HighsSparseMatrix(&local_a0);
      std::vector<double,_std::allocator<double>_>::push_back(local_3b8,&lower);
    }
  }
  HighsSparseMatrix::ensureColwise(local_3a8);
  HighsSparseMatrix::ensureColwise(local_3c0);
  local_3c0 = (HighsSparseMatrix *)&(this->standard_form_matrix_).start_;
  this_01 = &(this->standard_form_matrix_).value_;
  this_02 = &(this->standard_form_matrix_).index_;
  local_3a8 = (HighsSparseMatrix *)0x0;
  local_3b8 = (vector<double,_std::allocator<double>_> *)0x0;
  local_3ac = 0;
  local_3b0 = 0;
  local_394 = 0;
  for (lVar13 = 0; lVar13 < (this->model_).lp_.num_col_; lVar13 = lVar13 + 1) {
    dVar16 = (this->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar13] * dVar15;
    dVar1 = (this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar13];
    dVar2 = (this->model_).lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar13];
    if (dVar1 == -INFINITY) {
      if (dVar2 == INFINITY) {
        lower = -dVar16;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_390,&lower);
        local_394 = local_394 + 1;
        piVar9 = (((_Vector_base<int,_std::allocator<int>_> *)&local_3c0->format_)->_M_impl).
                 super__Vector_impl_data._M_start;
        lVar12 = (long)piVar9[lVar13];
        lVar10 = lVar12 * 4;
        for (; lVar12 < piVar9[lVar13 + 1]; lVar12 = lVar12 + 1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (this_02,(value_type_conflict2 *)
                             ((long)(this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start + lVar10));
          lower = -*(double *)
                    ((long)(this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar10 * 2);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_01,&lower);
          piVar9 = (((_Vector_base<int,_std::allocator<int>_> *)&local_3c0->format_)->_M_impl).
                   super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 4;
        }
        lower = (double)CONCAT44(lower._4_4_,
                                 (int)((ulong)((long)(this->standard_form_matrix_).index_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this->standard_form_matrix_).index_.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start) >> 2))
        ;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)local_3c0,(int *)&lower);
      }
      else {
        this->standard_form_offset_ = dVar16 * dVar2 + this->standard_form_offset_;
        (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar13] = -dVar16;
        pdVar6 = (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        piVar9 = (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar4 = piVar9[lVar13 + 1];
        pdVar7 = (this->standard_form_matrix_).value_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        piVar8 = (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        for (lVar10 = (long)piVar9[lVar13]; lVar10 < iVar4; lVar10 = lVar10 + 1) {
          iVar5 = piVar8[lVar10];
          pdVar6[iVar5] = pdVar6[iVar5] - pdVar7[lVar10] * dVar2;
          pdVar7[lVar10] = -pdVar7[lVar10];
        }
        local_3b0 = local_3b0 + 1;
      }
    }
    else {
      if (dVar2 == INFINITY) {
        local_3ac = local_3ac + 1;
      }
      else if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        local_3b8 = (vector<double,_std::allocator<double>_> *)(ulong)((int)local_3b8 + 1);
      }
      else {
        local_3a8 = (HighsSparseMatrix *)(ulong)((int)local_3a8 + 1);
      }
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        this->standard_form_offset_ = dVar16 * dVar1 + this->standard_form_offset_;
        pdVar6 = (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        piVar9 = (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar4 = piVar9[lVar13 + 1];
        pdVar7 = (this->standard_form_matrix_).value_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        piVar8 = (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        for (lVar10 = (long)piVar9[lVar13]; lVar10 < iVar4; lVar10 = lVar10 + 1) {
          iVar5 = piVar8[lVar10];
          pdVar6[iVar5] = pdVar6[iVar5] - pdVar7[lVar10] * dVar1;
        }
      }
    }
  }
  for (lVar13 = 0;
      lVar13 < (int)((ulong)((long)slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2); lVar13 = lVar13 + 1) {
    uVar3 = slack_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar13];
    lower = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_390,&lower);
    if ((int)uVar3 < 1) {
      lower = (double)CONCAT44(lower._4_4_,~uVar3);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_02,(int *)&lower);
      lower = -1.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_01,&lower);
    }
    else {
      lower = (double)CONCAT44(lower._4_4_,uVar3 - 1);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_02,(int *)&lower);
      lower = 1.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_01,&lower);
    }
    lower = (double)CONCAT44(lower._4_4_,
                             (int)((ulong)((long)(this->standard_form_matrix_).index_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->standard_form_matrix_).index_.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start) >> 2));
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)local_3c0,(int *)&lower);
  }
  this->standard_form_valid_ = true;
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
               "Standard form LP obtained for LP with (free / lower / upper / boxed / fixed) variables (%d / %d / %d / %d / %d) and constraints (%d / %d / %d / %d / %d) \n"
               ,(ulong)local_394,(ulong)local_3ac,(ulong)local_3b0,local_3b8,local_3a8,uVar14,
               local_380,local_378,local_388,local_370);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&slack_ix.super__Vector_base<int,_std::allocator<int>_>);
  HighsSparseMatrix::~HighsSparseMatrix(&local_row);
  return kOk;
}

Assistant:

HighsStatus Highs::formStandardFormLp() {
  this->clearStandardFormLp();
  HighsLp& lp = this->model_.lp_;
  HighsSparseMatrix& matrix = lp.a_matrix_;
  // Ensure that the incumbent LP and standard form LP matrices are rowwise
  matrix.ensureRowwise();
  // Original rows are processed before columns, so that any original
  // boxed rows can be transformed to pairs of one-sided rows,
  // requiring the standard form matrix to be row-wise. The original
  // columns are assumed to come before any new columns, so their
  // costs (as a minimization) must be defined befor costs of new
  // columns.
  // Determine the objective scaling, and apply it to any offset
  HighsInt sense = HighsInt(lp.sense_);
  this->standard_form_offset_ = sense * lp.offset_;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    this->standard_form_cost_.push_back(sense * lp.col_cost_[iCol]);
  this->standard_form_matrix_.format_ = MatrixFormat::kRowwise;
  this->standard_form_matrix_.num_col_ = lp.num_col_;
  // Create a HighsSparseMatrix instance to store rows extracted from
  // the original constraint matrix
  HighsInt local_row_min_nnz = std::max(lp.num_col_, HighsInt(2));
  HighsSparseMatrix local_row;
  local_row.ensureRowwise();
  local_row.num_row_ = 1;
  local_row.num_col_ = lp.num_col_;
  local_row.index_.resize(local_row_min_nnz);
  local_row.value_.resize(local_row_min_nnz);
  local_row.start_.resize(2);
  HighsInt& num_nz = local_row.start_[1];
  local_row.start_[0] = 0;
  HighsInt num_fixed_row = 0;
  HighsInt num_boxed_row = 0;
  HighsInt num_lower_row = 0;
  HighsInt num_upper_row = 0;
  HighsInt num_free_row = 0;
  HighsInt num_fixed_col = 0;
  HighsInt num_boxed_col = 0;
  HighsInt num_lower_col = 0;
  HighsInt num_upper_col = 0;
  HighsInt num_free_col = 0;
  std::vector<HighsInt> slack_ix;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    double lower = lp.row_lower_[iRow];
    double upper = lp.row_upper_[iRow];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      assert(0 == 1);
      // Free row
      num_free_row++;
      continue;
    }
    if (lower == upper) {
      // Equality row
      num_fixed_row++;
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
      continue;
    } else if (lower <= -kHighsInf) {
      // Upper bounded row, so record the slack
      num_upper_row++;
      assert(upper < kHighsInf);
      HighsInt standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(standard_form_row + 1);
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
    } else if (upper >= kHighsInf) {
      // Lower bounded row, so record the slack
      num_lower_row++;
      assert(lower > -kHighsInf);
      HighsInt standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(-(standard_form_row + 1));
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(lower);
    } else {
      // Boxed row, so record the lower slack
      assert(lower > -kHighsInf);
      assert(upper < kHighsInf);
      num_boxed_row++;
      HighsInt standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(-(standard_form_row + 1));
      matrix.getRow(iRow, num_nz, local_row.index_.data(),
                    local_row.value_.data());
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(lower);
      // .. and upper slack, adding a copy of the row
      standard_form_row = this->standard_form_rhs_.size();
      slack_ix.push_back(standard_form_row + 1);
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
    }
  }
  // Add rows corresponding to boxed columns
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    if (lower > -kHighsInf && upper < kHighsInf) {
      // Boxed column
      //
      // x will be replaced by x = l + X (below) with X >= 0
      //
      // Introduce variable s >= 0 so that (with x >= l still)
      //
      // x = u - s => x + s = u
      this->standard_form_cost_.push_back(0);
      this->standard_form_matrix_.num_col_++;
      local_row.num_col_++;
      local_row.index_[0] = iCol;
      local_row.index_[1] = this->standard_form_matrix_.num_col_ - 1;
      local_row.value_[0] = 1;
      local_row.value_[1] = 1;
      local_row.start_[1] = 2;
      this->standard_form_matrix_.addRows(local_row);
      this->standard_form_rhs_.push_back(upper);
    }
  }
  // Finished with both matrices, row-wise, so ensure that the
  // incumbent matrix leaves col-wise, and that the standard form
  // matrix is col-wise so RHS shifts can be applied and more columns
  // can be added
  matrix.ensureColwise();
  this->standard_form_matrix_.ensureColwise();
  // Work through the columns, ensuring that all have non-negativity bounds
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double cost = sense * lp.col_cost_[iCol];
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    if (lower > -kHighsInf) {
      // Finite lower bound
      if (upper < kHighsInf) {
        if (lower == upper) {
          // Fixed column
          num_fixed_col++;
        } else {
          // Boxed column
          num_boxed_col++;
        }
      } else {
        // Lower column
        num_lower_col++;
      }
      if (lower != 0) {
        // x >= l, so shift x-l = X >= 0, giving x = X + l
        //
        // Cost contribution c(X+l) = cX + cl
        this->standard_form_offset_ += cost * lower;
        // Constraint contribution a(X+l) = aX + al
        for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
             iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++)
          this->standard_form_rhs_[this->standard_form_matrix_.index_[iEl]] -=
              this->standard_form_matrix_.value_[iEl] * lower;
      }
    } else if (upper < kHighsInf) {
      // Upper column
      num_upper_col++;
      // Have to operate even if u=0, since cost and column values are negated
      //
      // x <= u, so shift u-x = X >= 0, giving x = u - X
      //
      // Cost contribution c(u-X) = cu - cX
      this->standard_form_offset_ += cost * upper;
      this->standard_form_cost_[iCol] = -cost;
      // Constraint contribution a(u-X) = -aX + au
      for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
           iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++) {
        this->standard_form_rhs_[this->standard_form_matrix_.index_[iEl]] -=
            this->standard_form_matrix_.value_[iEl] * upper;
        this->standard_form_matrix_.value_[iEl] =
            -this->standard_form_matrix_.value_[iEl];
      }
    } else {
      // Free column
      num_free_col++;
      // Represent as x = x+ - x-
      //
      // where original column is now x+ >= 0
      //
      // and x- >= 0 has negation of its cost and matrix column
      this->standard_form_cost_.push_back(-cost);
      for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
           iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++) {
        this->standard_form_matrix_.index_.push_back(
            this->standard_form_matrix_.index_[iEl]);
        this->standard_form_matrix_.value_.push_back(
            -this->standard_form_matrix_.value_[iEl]);
      }
      this->standard_form_matrix_.start_.push_back(
          HighsInt(this->standard_form_matrix_.index_.size()));
    }
  }
  // Now add the slack variables
  for (HighsInt iX = 0; iX < HighsInt(slack_ix.size()); iX++) {
    HighsInt iRow = slack_ix[iX];
    this->standard_form_cost_.push_back(0);
    if (iRow > 0) {
      this->standard_form_matrix_.index_.push_back(iRow - 1);
      this->standard_form_matrix_.value_.push_back(1);
    } else {
      this->standard_form_matrix_.index_.push_back(-iRow - 1);
      this->standard_form_matrix_.value_.push_back(-1);
    }
    this->standard_form_matrix_.start_.push_back(
        HighsInt(this->standard_form_matrix_.index_.size()));
  }
  this->standard_form_valid_ = true;
  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "Standard form LP obtained for LP with (free / lower / upper / "
               "boxed / fixed) variables"
               " (%d / %d / %d / %d / %d) and constraints"
               " (%d / %d / %d / %d / %d) \n",
               int(num_free_col), int(num_lower_col), int(num_upper_col),
               int(num_boxed_col), int(num_fixed_col), int(num_free_row),
               int(num_lower_row), int(num_upper_row), int(num_boxed_row),
               int(num_fixed_row));
  return HighsStatus::kOk;
}